

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

size_t art_size_in_bytes_at(art_node_t *node)

{
  _Bool _Var1;
  byte bVar2;
  size_t sVar3;
  art_node_t *node_00;
  art_inner_node_t *in_RDI;
  art_indexed_child_t indexed_child;
  size_t size;
  int in_stack_ffffffffffffffbc;
  art_indexed_child_t local_28;
  art_node_t *local_8;
  
  _Var1 = art_is_leaf((art_node_t *)in_RDI);
  if (_Var1) {
    local_8 = (art_node_t *)0x0;
  }
  else {
    local_8 = (art_node_t *)0x0;
    bVar2 = art_get_type(in_RDI);
    node_00 = (art_node_t *)(ulong)bVar2;
    switch(node_00) {
    case (art_node_t *)0x0:
      local_8 = local_8 + 0x30;
      break;
    case (art_node_t *)0x1:
      local_8 = local_8 + 0x98;
      break;
    case (art_node_t *)0x2:
      local_8 = local_8 + 0x290;
      break;
    case (art_node_t *)0x3:
      local_8 = local_8 + 0x810;
    }
    local_28 = art_node_next_child(node_00,in_stack_ffffffffffffffbc);
    while (local_28.child != (art_node_t *)0x0) {
      sVar3 = art_size_in_bytes_at(local_8);
      local_8 = local_8 + sVar3;
      local_28 = art_node_next_child(node_00,in_stack_ffffffffffffffbc);
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t art_size_in_bytes_at(const art_node_t *node) {
    if (art_is_leaf(node)) {
        return 0;
    }
    size_t size = 0;
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE: {
            size += sizeof(art_node4_t);
        } break;
        case ART_NODE16_TYPE: {
            size += sizeof(art_node16_t);
        } break;
        case ART_NODE48_TYPE: {
            size += sizeof(art_node48_t);
        } break;
        case ART_NODE256_TYPE: {
            size += sizeof(art_node256_t);
        } break;
        default:
            assert(false);
            break;
    }
    art_indexed_child_t indexed_child = art_node_next_child(node, -1);
    while (indexed_child.child != NULL) {
        size += art_size_in_bytes_at(indexed_child.child);
        indexed_child = art_node_next_child(node, indexed_child.index);
    }
    return size;
}